

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

LIBSSH2_LISTENER *
libssh2_channel_forward_listen_ex
          (LIBSSH2_SESSION *session,char *host,int port,int *bound_port,int queue_maxsize)

{
  libssh2_nonblocking_states lVar1;
  int iVar2;
  time_t start_time;
  size_t sVar3;
  uchar *puVar4;
  LIBSSH2_LISTENER *entry;
  char *pcVar5;
  uint32_t uVar6;
  char *__s;
  uchar *data;
  uchar *local_58;
  int local_4c;
  ulong local_48;
  list_head *local_40;
  int *local_38;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    local_4c = queue_maxsize;
    local_38 = bound_port;
    start_time = time((time_t *)0x0);
    __s = "0.0.0.0";
    if (host != (char *)0x0) {
      __s = host;
    }
    local_40 = &session->listeners;
    do {
      lVar1 = session->fwdLstn_state;
      if (lVar1 == libssh2_NB_state_sent) {
LAB_00109baa:
        iVar2 = _libssh2_packet_requirev
                          (session,"QR",&data,&local_48,0,(uchar *)0x0,0,
                           &session->fwdLstn_packet_requirev_state);
        if (iVar2 == -0x25) {
          iVar2 = -0x25;
          pcVar5 = "Would block";
          goto LAB_00109d02;
        }
        if ((iVar2 != 0) || (local_48 == 0)) {
          iVar2 = -0xe;
          pcVar5 = "Unknown";
LAB_00109d1d:
          _libssh2_error(session,iVar2,pcVar5);
LAB_00109d22:
          session->fwdLstn_state = libssh2_NB_state_idle;
          goto LAB_00109d2a;
        }
        if (*data == 'R') {
          (*session->free)(data,&session->abstract);
          iVar2 = -0x20;
          pcVar5 = "Unable to complete request for forward-listen";
          goto LAB_00109d1d;
        }
        if (*data != 'Q') goto LAB_00109d22;
        entry = (LIBSSH2_LISTENER *)_libssh2_calloc(session,0x60);
        if (entry == (LIBSSH2_LISTENER *)0x0) {
          _libssh2_error(session,-6,"Unable to allocate memory for listener queue");
LAB_00109d8d:
          entry = (LIBSSH2_LISTENER *)0x0;
        }
        else {
          pcVar5 = (char *)(*session->alloc)((long)session->fwdLstn_host_len + 1,&session->abstract)
          ;
          entry->host = pcVar5;
          if (pcVar5 == (char *)0x0) {
            _libssh2_error(session,-6,"Unable to allocate memory for listener queue");
            (*session->free)(entry,&session->abstract);
            goto LAB_00109d8d;
          }
          entry->session = session;
          memcpy(pcVar5,__s,(ulong)session->fwdLstn_host_len);
          entry->host[session->fwdLstn_host_len] = '\0';
          uVar6 = port;
          if ((port == 0) && (4 < local_48)) {
            uVar6 = _libssh2_ntohu32(data + 1);
          }
          entry->port = uVar6;
          entry->queue_size = 0;
          entry->queue_maxsize = local_4c;
          _libssh2_list_add(local_40,(list_node *)entry);
          if (local_38 != (int *)0x0) {
            *local_38 = entry->port;
          }
        }
        (*session->free)(data,&session->abstract);
        session->fwdLstn_state = libssh2_NB_state_idle;
      }
      else {
        if (lVar1 == libssh2_NB_state_created) {
LAB_00109b4f:
          iVar2 = _libssh2_transport_send
                            (session,session->fwdLstn_packet,(ulong)session->fwdLstn_packet_len,
                             (uchar *)0x0,0);
          if (iVar2 == 0) {
            (*session->free)(session->fwdLstn_packet,&session->abstract);
            session->fwdLstn_packet = (uchar *)0x0;
            session->fwdLstn_state = libssh2_NB_state_sent;
            goto LAB_00109baa;
          }
          if (iVar2 != -0x25) {
            _libssh2_error(session,-7,
                           "Unable to send global-request packet for forward listen request");
            (*session->free)(session->fwdLstn_packet,&session->abstract);
            session->fwdLstn_packet = (uchar *)0x0;
            goto LAB_00109d22;
          }
          iVar2 = -0x25;
          pcVar5 = "Would block sending global-request packet for forward listen request";
        }
        else {
          if (lVar1 != libssh2_NB_state_idle) goto LAB_00109d22;
          sVar3 = strlen(__s);
          session->fwdLstn_host_len = (uint32_t)sVar3;
          uVar6 = (uint32_t)sVar3 + 0x1b;
          session->fwdLstn_packet_len = uVar6;
          (session->fwdLstn_packet_requirev_state).start = 0;
          puVar4 = (uchar *)(*session->alloc)((size_t)uVar6,&session->abstract);
          session->fwdLstn_packet = puVar4;
          if (puVar4 != (uchar *)0x0) {
            local_58 = puVar4 + 1;
            *puVar4 = 'P';
            _libssh2_store_str(&local_58,"tcpip-forward",0xd);
            *local_58 = '\x01';
            local_58 = local_58 + 1;
            _libssh2_store_str(&local_58,__s,(ulong)session->fwdLstn_host_len);
            _libssh2_store_u32(&local_58,port);
            session->fwdLstn_state = libssh2_NB_state_created;
            goto LAB_00109b4f;
          }
          iVar2 = -6;
          pcVar5 = "Unable to allocate memory for setenv packet";
        }
LAB_00109d02:
        _libssh2_error(session,iVar2,pcVar5);
LAB_00109d2a:
        entry = (LIBSSH2_LISTENER *)0x0;
      }
      if (entry != (LIBSSH2_LISTENER *)0x0) {
        return entry;
      }
      if (session->api_block_mode == 0) {
        return (LIBSSH2_LISTENER *)0x0;
      }
      iVar2 = libssh2_session_last_errno(session);
    } while ((iVar2 == -0x25) && (iVar2 = _libssh2_wait_socket(session,start_time), iVar2 == 0));
  }
  return (LIBSSH2_LISTENER *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_LISTENER *
libssh2_channel_forward_listen_ex(LIBSSH2_SESSION *session, const char *host,
                                  int port, int *bound_port, int queue_maxsize)
{
    LIBSSH2_LISTENER *ptr;

    if(!session)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, session,
                       channel_forward_listen(session, host, port, bound_port,
                                              queue_maxsize));
    return ptr;
}